

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O1

void es::init::singleton<Data<0U>,_es::init::early_initializer,_void,_std::ios_base::Init>::
     active_delete(void)

{
  bool bVar1;
  
  do {
    LOCK();
    bVar1 = singleton_meta_data_node._lock._spinlock == false;
    if (bVar1) {
      singleton_meta_data_node._lock._spinlock = true;
    }
    UNLOCK();
  } while (bVar1);
  active_delete::active_delete_count = active_delete::active_delete_count + 1;
  fprintf(_stdout,"Data::dtor %s\n","Data<0>::~Data() [V = 0]");
  singleton_meta_data_node._p = (void *)0x0;
  LOCK();
  singleton_meta_data_node._lock._spinlock = false;
  UNLOCK();
  return;
}

Assistant:

static void active_delete()
    {
        std::lock_guard<tc_spin_lock> guard(singleton_meta_data_node._lock);

        static uint64_t active_delete_count{0};
        ++active_delete_count;
        if constexpr (es::init::verbose_singletons)
        {
            std::cerr << "active_delete - " << __PRETTY_FUNCTION__ << " " << (void*)singleton_meta_data_node._p << " "
                      << active_delete_count << std::endl;
        }
        // call dtor, without releasing memory, which is statically allocated in the union.
        static_cast<T*>(singleton_meta_data_node._p)->~T();
        singleton_meta_data_node._p = nullptr;
    }